

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__writer.cc
# Opt level: O1

bool __thiscall xemmai::io::t_writer::f__resume(t_writer *this,t_io *a_library)

{
  t_object *ptVar1;
  t_queue<256UL> *this_00;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  if ((this->v_value).v_p._M_b._M_p == (__pointer_type)0x0) {
LAB_00174da0:
    bVar2 = true;
    iVar3 = this->v_step + -1;
    switch(iVar3) {
    case 0:
switchD_00174dbe_caseD_0:
      bVar2 = f_write(this,a_library);
      if (bVar2) {
        this->v_step = this->v_step + -1;
        return true;
      }
      break;
    case 1:
      goto switchD_00174dbe_caseD_1;
    case 3:
      this->v_p0 = (char *)L"\n";
      this->v_n0 = 4;
      this->v_step = iVar3;
    case 2:
      bVar2 = f_write(this,a_library,&this->v_p0,&this->v_n0);
      if (bVar2) {
        this->v_step = this->v_step + -1;
switchD_00174dbe_caseD_1:
        bVar2 = f_write(this,a_library,(char **)0x0,(size_t *)0x0);
        if (!bVar2) {
          return false;
        }
        this->v_step = this->v_step + -1;
        goto switchD_00174dbe_caseD_0;
      }
      break;
    default:
      goto switchD_00174dbe_default;
    }
  }
  else {
    bVar2 = f_write(this,a_library,&this->v_p0,&this->v_n0);
    if (bVar2) {
      LOCK();
      ptVar1 = (this->v_value).v_p._M_b._M_p;
      (this->v_value).v_p._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if ((t_object *)0x4 < ptVar1) {
        this_00 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
        *this_00->v_head = ptVar1;
        if (this_00->v_head == this_00->v_next) {
          t_slot::t_queue<256UL>::f_next(this_00);
        }
        else {
          this_00->v_head = this_00->v_head + 1;
        }
      }
      goto LAB_00174da0;
    }
  }
  bVar2 = false;
switchD_00174dbe_default:
  return bVar2;
}

Assistant:

bool t_writer::f__resume(t_io* a_library)
{
	if (v_value) {
		if (!f_write(a_library, &v_p0, &v_n0)) return false;
		v_value = nullptr;
	}
	switch (v_step) {
	case 4:
		v_p0 = const_cast<char*>(reinterpret_cast<const char*>(L"\n"));
		v_n0 = sizeof(wchar_t);
		--v_step;
	case 3:
		if (!f_write(a_library, &v_p0, &v_n0)) return false;
		--v_step;
	case 2:
		if (!f_write(a_library, NULL, NULL)) return false;
		--v_step;
	case 1:
		if (!f_write(a_library)) return false;
		--v_step;
	}
	return true;
}